

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O3

void restore_light_sources(memfile *mf,level *lev)

{
  int8_t iVar1;
  int16_t iVar2;
  int32_t iVar3;
  ls_t *plVar4;
  uint uVar5;
  
  iVar3 = mread32(mf);
  if (0 < iVar3) {
    uVar5 = iVar3 + 1;
    do {
      plVar4 = (ls_t *)malloc(0x18);
      iVar3 = mread32(mf);
      plVar4->type = (short)iVar3;
      iVar2 = mread16(mf);
      plVar4->range = iVar2;
      iVar2 = mread16(mf);
      plVar4->flags = iVar2;
      iVar3 = mread32(mf);
      plVar4->id = (void *)(long)iVar3;
      iVar1 = mread8(mf);
      plVar4->x = iVar1;
      iVar1 = mread8(mf);
      plVar4->y = iVar1;
      plVar4->next = lev->lev_lights;
      lev->lev_lights = plVar4;
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  return;
}

Assistant:

void restore_light_sources(struct memfile *mf, struct level *lev)
{
    int count;
    long id;
    light_source *ls;

    /* restore elements */
    count = mread32(mf);

    while (count-- > 0) {
	ls = malloc(sizeof(light_source));
	ls->type = mread32(mf);
	ls->range = mread16(mf);
	ls->flags = mread16(mf);
	id = mread32(mf); /* prevent: "cast to pointer from integer of different size" */
	ls->id = (void*)id;
	ls->x = mread8(mf);
	ls->y = mread8(mf);
	
	ls->next = lev->lev_lights;
	lev->lev_lights = ls;
    }
}